

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::ClearNodeVector
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this)

{
  Node *block;
  long lVar1;
  hash_t i;
  ulong uVar2;
  
  lVar1 = 0x10;
  for (uVar2 = 0; block = this->Nodes, uVar2 < this->Size; uVar2 = uVar2 + 1) {
    if (*(long *)((long)block + lVar1 + -0x10) != 1) {
      TArray<FUDMFKey,_FUDMFKey>::~TArray
                ((TArray<FUDMFKey,_FUDMFKey> *)((long)&block->Next + lVar1));
    }
    lVar1 = lVar1 + 0x28;
  }
  M_Free(block);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}